

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_DeviceMethodResponse
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,METHOD_HANDLE methodId,uchar *response,
          size_t response_size,int status_response)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_RESULT IVar3;
  char *pcVar4;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0 || methodId == (METHOD_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar4 = "result = %s";
    IVar3 = IOTHUB_CLIENT_INVALID_ARG;
    iVar1 = 0xaa5;
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_DeviceMethod_Response)
                      (iotHubClientHandle->deviceHandle,methodId,response,response_size,
                       status_response);
    if (iVar1 == 0) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar3 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = "IoTHubTransport_DeviceMethod_Response failed";
    iVar1 = 0xaac;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_DeviceMethodResponse",iVar1,1,pcVar4);
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_DeviceMethodResponse(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, METHOD_HANDLE methodId, const unsigned char* response, size_t response_size, int status_response)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL || methodId == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if (handleData->IoTHubTransport_DeviceMethod_Response(handleData->deviceHandle, methodId, response, response_size, status_response) != 0)
        {
            LogError("IoTHubTransport_DeviceMethod_Response failed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    return result;
}